

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O3

void Acb_ObjAddFaninFanout(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if (iObj < (p->vObjFans).nSize) {
    iVar1 = (p->vObjFans).pArray[(uint)iObj];
    lVar4 = (long)iVar1;
    if ((lVar4 < 0) || ((p->vFanSto).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar2 = (p->vFanSto).pArray;
    if (0 < piVar2[lVar4]) {
      lVar3 = 0;
      do {
        iVar1 = piVar2[lVar4 + lVar3 + 1];
        if (((long)iVar1 < 0) || ((p->vFanouts).nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        lVar3 = lVar3 + 1;
        Vec_IntPush((p->vFanouts).pArray + iVar1,iObj);
      } while (lVar3 < piVar2[lVar4]);
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline void Acb_ObjAddFaninFanout( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins; 
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Vec_IntPush( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
}